

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

int __thiscall
libtorrent::aux::session_impl::listen_port(session_impl *this,transport ssl,address *param_2)

{
  anon_class_16_2_b24388f0_for__M_pred __pred;
  bool bVar1;
  __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *this_01;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  local_58;
  transport *local_50;
  shared_ptr<libtorrent::aux::listen_socket_t> *local_48;
  shared_ptr<libtorrent::aux::listen_socket_t> *local_40;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  local_38;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  local_30;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  socket;
  address *local_addr_local;
  session_impl *psStack_18;
  transport ssl_local;
  session_impl *this_local;
  
  socket._M_current = (shared_ptr<libtorrent::aux::listen_socket_t> *)param_2;
  local_addr_local._7_1_ = ssl;
  psStack_18 = this;
  local_38._M_current =
       (shared_ptr<libtorrent::aux::listen_socket_t> *)
       ::std::
       vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ::begin(&this->m_listen_sockets);
  local_40 = (shared_ptr<libtorrent::aux::listen_socket_t> *)
             ::std::
             vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             ::end(&this->m_listen_sockets);
  local_50 = (transport *)((long)&local_addr_local + 7);
  local_48 = socket._M_current;
  __pred.local_addr = (address *)socket._M_current;
  __pred.ssl = local_50;
  local_30 = ::std::
             find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>const*,std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>>,libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                       (local_38,(__normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                  )local_40,__pred);
  local_58._M_current =
       (shared_ptr<libtorrent::aux::listen_socket_t> *)
       ::std::
       vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ::end(&this->m_listen_sockets);
  bVar1 = __gnu_cxx::operator!=(&local_30,&local_58);
  if (bVar1) {
    this_00 = (__shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                 ::operator*(&local_30);
    this_01 = ::std::
              __shared_ptr_access<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    this_local._4_4_ = listen_socket_t::tcp_external_port(this_01);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int session_impl::listen_port(transport const ssl, address const& local_addr) const
	{
		auto socket = std::find_if(m_listen_sockets.begin(), m_listen_sockets.end()
			, [&](std::shared_ptr<listen_socket_t> const& e)
		{
			if (!(e->flags & listen_socket_t::accept_incoming)) return false;
			auto const& listen_addr = e->external_address.external_address();
			return e->ssl == ssl
				&& (listen_addr == local_addr
					|| (listen_addr.is_v4() == local_addr.is_v4() && listen_addr.is_unspecified()));
		});
		if (socket != m_listen_sockets.end())
			return (*socket)->tcp_external_port();
		return 0;
	}